

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointActionObservationHistory.cpp
# Opt level: O2

string * __thiscall
JointActionObservationHistory::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,JointActionObservationHistory *this)

{
  MultiAgentDecisionProcessDiscreteInterface *pMVar1;
  long *plVar2;
  ostream *poVar3;
  E *this_00;
  char *pcVar4;
  string local_1c0;
  stringstream ss;
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  if (this->_m_pred != (JointActionObservationHistory *)0x0) {
    if ((this->super_JointHistory).super_History._m_length == 0) {
      poVar3 = std::operator<<(local_190,
                               "JointActionObservationHistory:Print() -Warning:_m_pred != ");
      poVar3 = std::operator<<(poVar3,"null, but lenght <= 1 !");
      std::endl<char,std::char_traits<char>>(poVar3);
      this_00 = (E *)__cxa_allocate_exception(0x28);
      E::E(this_00,&ss);
      __cxa_throw(this_00,&E::typeinfo,E::~E);
    }
    SoftPrint_abi_cxx11_(&local_1c0,this->_m_pred);
    std::operator<<(local_190,(string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::operator<<(local_190,", ");
  }
  if ((this->super_JointHistory).super_History._m_length == 0) {
    pcVar4 = "<EMPTY>";
  }
  else {
    std::operator<<(local_190,"< ");
    pMVar1 = this->_m_planningUnitMADPDiscrete->_m_madp;
    plVar2 = (long *)(**(code **)((long)*pMVar1 + 0x80))(pMVar1,this->_m_jaI);
    (**(code **)(*plVar2 + 0x20))(&local_1c0,plVar2);
    std::operator<<(local_190,(string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::operator<<(local_190,", ");
    pMVar1 = this->_m_planningUnitMADPDiscrete->_m_madp;
    plVar2 = (long *)(**(code **)((long)*pMVar1 + 0xd8))(pMVar1,this->_m_joI);
    (**(code **)(*plVar2 + 0x20))(&local_1c0,plVar2);
    std::operator<<(local_190,(string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    pcVar4 = " >";
  }
  std::operator<<(local_190,pcVar4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

string JointActionObservationHistory::SoftPrint() const
{
    stringstream ss;
    if(_m_pred != 0)
    {
        if(_m_length >= 1)
        {
            ss << _m_pred->SoftPrint();
            ss << ", ";
        }
        else
        {
            ss << "JointActionObservationHistory:Print() -Warning:_m_pred != "
                << "null, but lenght <= 1 !"<<endl;
            throw E(ss);
        }
    }

    if (_m_length >= 1) 
    {
        ss << "< ";    
        ss << _m_planningUnitMADPDiscrete->GetJointAction(_m_jaI)->SoftPrintBrief();
        ss << ", ";    
        ss << _m_planningUnitMADPDiscrete->GetJointObservation(_m_joI)->SoftPrintBrief();
        ss << " >";    
    }
    else
        ss << "<EMPTY>";


    return(ss.str());

}